

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# haar.cpp
# Opt level: O2

HaarWavelet * __thiscall
imagestego::experimental::impl::HaarWavelet::transform(HaarWavelet *this,Mat *mat)

{
  undefined8 uVar1;
  pointer pfVar2;
  HaarWavelet *in_RDX;
  size_type __n;
  future<cv::Mat> *f;
  long lVar3;
  pointer pfVar4;
  undefined1 local_151 [9];
  vector<cv::Mat,_std::allocator<cv::Mat>_> _planes;
  vector<cv::Mat,_std::allocator<cv::Mat>_> planes;
  vector<std::future<cv::Mat>,_std::allocator<std::future<cv::Mat>_>_> futures;
  _InputArray local_f0 [4];
  _OutputArray local_90 [4];
  
  cv::Mat::Mat((Mat *)this);
  futures.super__Vector_base<std::future<cv::Mat>,_std::allocator<std::future<cv::Mat>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  futures.super__Vector_base<std::future<cv::Mat>,_std::allocator<std::future<cv::Mat>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  futures.super__Vector_base<std::future<cv::Mat>,_std::allocator<std::future<cv::Mat>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  planes.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  planes.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  planes.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  _planes.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  _planes.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  _planes.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_151._1_8_ = this;
  if ((((_InputArray *)&in_RDX->field_0x0)->flags & 7U) == 3) {
    local_f0[0].sz.width = 0;
    local_f0[0].sz.height = 0;
    local_f0[0].flags = 0x1010000;
    local_90[0].super__InputArray.sz.width = 0;
    local_90[0].super__InputArray.sz.height = 0;
    local_90[0].super__InputArray.flags = 0x2050000;
    local_90[0].super__InputArray.obj = &_planes;
    local_f0[0].obj = in_RDX;
    cv::split(local_f0,local_90);
  }
  else {
    local_f0[0].sz.width = 0;
    local_f0[0].sz.height = 0;
    local_f0[0].flags = 0x2010000;
    local_f0[0].obj = this;
    cv::Mat::convertTo((_OutputArray *)in_RDX,(int)local_f0,1.0,0.0);
    local_f0[0].sz.width = 0;
    local_f0[0].sz.height = 0;
    local_f0[0].flags = 0x1010000;
    local_90[0].super__InputArray.sz.width = 0;
    local_90[0].super__InputArray.sz.height = 0;
    local_90[0].super__InputArray.flags = 0x2050000;
    local_90[0].super__InputArray.obj = &_planes;
    local_f0[0].obj = this;
    cv::split(local_f0,local_90);
  }
  lVar3 = 0x60;
  for (__n = 1; __n != ((long)_planes.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)_planes.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                             super__Vector_impl_data._M_start) / 0x60; __n = __n + 1) {
    local_90[0].super__InputArray._0_8_ =
         _planes.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
         super__Vector_impl_data._M_start + lVar3;
    std::
    async<imagestego::experimental::impl::HaarWavelet::transform(cv::Mat_const&)::_lambda(cv::Mat_const&)_1_,std::reference_wrapper<cv::Mat_const>>
              ((anon_class_1_0_00000001_for__M_head_impl *)local_f0,
               (reference_wrapper<const_cv::Mat> *)local_151);
    std::vector<std::future<cv::Mat>,std::allocator<std::future<cv::Mat>>>::
    emplace_back<std::future<cv::Mat>>
              ((vector<std::future<cv::Mat>,std::allocator<std::future<cv::Mat>>> *)&futures,
               (future<cv::Mat> *)local_f0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_f0[0].obj);
    lVar3 = lVar3 + 0x60;
  }
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::reserve(&planes,__n);
  uVar1 = local_151._1_8_;
  horizontalLifting((HaarWavelet *)local_90,
                    _planes.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                    super__Vector_impl_data._M_start);
  verticalLifting((HaarWavelet *)local_f0,(Mat *)local_90);
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::emplace_back<cv::Mat>(&planes,(Mat *)local_f0);
  cv::Mat::~Mat((Mat *)local_f0);
  cv::Mat::~Mat((Mat *)local_90);
  pfVar2 = futures.super__Vector_base<std::future<cv::Mat>,_std::allocator<std::future<cv::Mat>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pfVar4 = futures.
                super__Vector_base<std::future<cv::Mat>,_std::allocator<std::future<cv::Mat>_>_>.
                _M_impl.super__Vector_impl_data._M_start; pfVar4 != pfVar2; pfVar4 = pfVar4 + 1) {
    std::future<cv::Mat>::get((future<cv::Mat> *)local_f0);
    std::vector<cv::Mat,_std::allocator<cv::Mat>_>::emplace_back<cv::Mat>(&planes,(Mat *)local_f0);
    cv::Mat::~Mat((Mat *)local_f0);
  }
  local_f0[0].sz.width = 0;
  local_f0[0].sz.height = 0;
  local_90[0].super__InputArray.sz.width = 0;
  local_90[0].super__InputArray.sz.height = 0;
  local_f0[0].flags = 0x1050000;
  local_90[0].super__InputArray.flags = 0x2010000;
  local_90[0].super__InputArray.obj = (void *)uVar1;
  local_f0[0].obj = &planes;
  cv::merge(local_f0,local_90);
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&_planes);
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&planes);
  std::vector<std::future<cv::Mat>,_std::allocator<std::future<cv::Mat>_>_>::~vector(&futures);
  return (HaarWavelet *)uVar1;
}

Assistant:

cv::Mat transform(const cv::Mat& mat) {
        cv::Mat dst;
        std::vector<std::future<cv::Mat>> futures;
        std::vector<cv::Mat> planes, _planes;
        if (mat.depth() != CV_16S) {
            mat.convertTo(dst, CV_16S);
            cv::split(dst, _planes);
        } else {
            cv::split(mat, _planes);
        }

        for (std::size_t i = 1; i != _planes.size(); ++i) {
            futures.emplace_back(std::async(
                [](const cv::Mat& mat) -> cv::Mat {
                    return verticalLifting(horizontalLifting(mat));
                },
                std::cref(_planes[i])));
        }
        planes.reserve(_planes.size());
        planes.emplace_back(verticalLifting(horizontalLifting(_planes.front())));
        for (auto&& f : futures) {
            planes.emplace_back(f.get());
        }
        cv::merge(planes, dst);
        return dst;
    }